

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O1

void P_GunShot(AActor *mo,bool accurate,PClassActor *pufftype,DAngle *pitch)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined7 in_register_00000031;
  FName local_44;
  DAngle local_40;
  DAngle local_38;
  
  uVar1 = FRandom::GenRand32(&pr_gunshot);
  local_38.Degrees = (mo->Angles).Yaw.Degrees;
  if ((int)CONCAT71(in_register_00000031,accurate) == 0) {
    uVar2 = FRandom::GenRand32(&pr_gunshot);
    uVar3 = FRandom::GenRand32(&pr_gunshot);
    local_38.Degrees =
         local_38.Degrees + (double)(int)((uVar2 & 0xff) - (uVar3 & 0xff)) * 0.02197265625;
  }
  local_40 = (DAngle)pitch->Degrees;
  local_44.Index = 200;
  P_LineAttack(mo,&local_38,8192.0,&local_40,((uVar1 & 0xff) % 3) * 5 + 5,&local_44,pufftype,0,
               (FTranslatedLineTarget *)0x0,(int *)0x0);
  return;
}

Assistant:

void P_GunShot (AActor *mo, bool accurate, PClassActor *pufftype, DAngle pitch)
{
	DAngle 	angle;
	int 		damage;
		
	damage = 5*(pr_gunshot()%3+1);
	angle = mo->Angles.Yaw;

	if (!accurate)
	{
		angle += pr_gunshot.Random2 () * (5.625 / 256);
	}

	P_LineAttack (mo, angle, PLAYERMISSILERANGE, pitch, damage, NAME_Hitscan, pufftype);
}